

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int decrypt_packet(ptls_cipher_context_t *header_protection,
                  _func_int_void_ptr_uint64_t_quicly_decoded_packet_t_ptr_size_t_size_t_ptr *aead_cb
                  ,void *aead_ctx,uint64_t *next_expected_pn,quicly_decoded_packet_t *packet,
                  uint64_t *pn,ptls_iovec_t *payload)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  uint8_t hpmask [5];
  size_t ptlen;
  undefined4 local_48;
  undefined1 local_44;
  void *local_40;
  size_t local_38;
  
  if ((packet->decrypted).pn == 0xffffffffffffffff) {
    local_44 = 0;
    local_48 = 0;
    if ((packet->octets).len - packet->encrypted_off < header_protection->algo->iv_size + 4) {
      *pn = 0xffffffffffffffff;
      return 0xff01;
    }
    local_40 = aead_ctx;
    (*header_protection->do_init)
              (header_protection,(packet->octets).base + packet->encrypted_off + 4);
    (*header_protection->do_transform)(header_protection,&local_48,&local_48,5);
    pbVar9 = (packet->octets).base;
    bVar1 = *pbVar9;
    *pbVar9 = ((byte)~bVar1 >> 3 | 0xf) & (byte)local_48 ^ bVar1;
    pbVar9 = (packet->octets).base;
    sVar12 = packet->encrypted_off;
    lVar7 = (ulong)(*pbVar9 & 3) + 1;
    uVar5 = 0;
    lVar13 = 0;
    do {
      pbVar9[lVar13 + sVar12] = pbVar9[lVar13 + sVar12] ^ *(byte *)((long)&local_48 + lVar13 + 1);
      pbVar9 = (packet->octets).base;
      sVar12 = packet->encrypted_off;
      lVar3 = lVar13 + sVar12;
      lVar13 = lVar13 + 1;
      uVar5 = (uint)pbVar9[lVar3] | uVar5 << 8;
    } while (lVar7 != lVar13);
    uVar6 = *next_expected_pn;
    uVar10 = 1L << (sbyte)((int)lVar7 << 3);
    uVar14 = (ulong)uVar5 | -uVar10 & uVar6;
    if (uVar6 < uVar14 + (uVar10 >> 1)) {
      uVar11 = uVar10;
      if (uVar14 < uVar10) {
        uVar11 = 0;
      }
      if (uVar14 <= uVar6 + (uVar10 >> 1)) {
        uVar11 = 0;
      }
      uVar10 = -uVar11;
    }
    *pn = uVar14 + uVar10;
    iVar4 = (*aead_cb)(local_40,uVar14 + uVar10,packet,sVar12 + lVar7,&local_38);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (*next_expected_pn <= *pn) {
      *next_expected_pn = *pn + 1;
    }
    payload->base = (packet->octets).base + sVar12 + lVar7;
    payload->len = local_38;
  }
  else {
    sVar12 = (packet->octets).len;
    sVar2 = packet->encrypted_off;
    payload->base = (packet->octets).base + sVar2;
    payload->len = sVar12 - sVar2;
    uVar6 = (packet->decrypted).pn;
    *pn = uVar6;
    if ((aead_cb == aead_decrypt_1rtt) &&
       (uVar10 = (packet->decrypted).key_phase,
       *(ulong *)(*(long *)((long)aead_ctx + 0x540) + 0xb0) < uVar10)) {
      iVar4 = received_key_update((quicly_conn_t *)aead_ctx,uVar10);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar6 = *pn;
    }
    if (*next_expected_pn < uVar6) {
      *next_expected_pn = uVar6 + 1;
    }
  }
  bVar1 = *(packet->octets).base;
  bVar8 = 0xc;
  if (-1 < (char)bVar1) {
    bVar8 = 0x18;
  }
  iVar4 = 0x2000a;
  if ((bVar8 & bVar1) == 0) {
    iVar4 = 0x2000a;
    if (payload->len != 0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int decrypt_packet(ptls_cipher_context_t *header_protection,
                          int (*aead_cb)(void *, uint64_t, quicly_decoded_packet_t *, size_t, size_t *), void *aead_ctx,
                          uint64_t *next_expected_pn, quicly_decoded_packet_t *packet, uint64_t *pn, ptls_iovec_t *payload)
{
    int ret;

    /* decrypt ourselves, or use the pre-decrypted input */
    if (packet->decrypted.pn == UINT64_MAX) {
        if ((ret = do_decrypt_packet(header_protection, aead_cb, aead_ctx, next_expected_pn, packet, pn, payload)) != 0)
            return ret;
    } else {
        *payload = ptls_iovec_init(packet->octets.base + packet->encrypted_off, packet->octets.len - packet->encrypted_off);
        *pn = packet->decrypted.pn;
        if (aead_cb == aead_decrypt_1rtt) {
            quicly_conn_t *conn = aead_ctx;
            if (conn->application->cipher.ingress.key_phase.decrypted < packet->decrypted.key_phase) {
                if ((ret = received_key_update(conn, packet->decrypted.key_phase)) != 0)
                    return ret;
            }
        }
        if (*next_expected_pn < *pn)
            *next_expected_pn = *pn + 1;
    }

    /* check reserved bits after AEAD decryption */
    if ((packet->octets.base[0] & (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0]) ? QUICLY_LONG_HEADER_RESERVED_BITS
                                                                                        : QUICLY_SHORT_HEADER_RESERVED_BITS)) !=
        0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: non-zero reserved bits (pn: %" PRIu64 ")\n", __FUNCTION__, *pn);
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }
    if (payload->len == 0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: payload length is zero (pn: %" PRIu64 ")\n", __FUNCTION__, *pn);
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }

    if (QUICLY_DEBUG) {
        char *payload_hex = quicly_hexdump(payload->base, payload->len, 4);
        fprintf(stderr, "%s: AEAD payload:\n%s", __FUNCTION__, payload_hex);
        free(payload_hex);
    }

    return 0;
}